

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O1

FT_UInt32 ps_unicode_value(char *glyph_name)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  uint in_EAX;
  uint uVar4;
  FT_UInt32 FVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  FT_UInt32 FVar12;
  uint uVar13;
  byte *pbVar14;
  uchar *puVar15;
  byte bVar16;
  long lVar17;
  ushort *puVar18;
  ushort uVar19;
  
  bVar16 = *glyph_name;
  if (((bVar16 == 0x75) && (glyph_name[1] == 'n')) && (glyph_name[2] == 'i')) {
    pbVar14 = (byte *)(glyph_name + 3);
    uVar10 = 5;
    in_EAX = 0;
    do {
      bVar1 = *pbVar14;
      uVar13 = bVar1 - 0x37;
      if (bVar1 - 0x47 < 0xfffffffa) {
        uVar13 = 0x10;
      }
      if (bVar1 - 0x30 < 10) {
        uVar13 = bVar1 - 0x30;
      }
      uVar4 = in_EAX * 0x10 + uVar13;
      if (0xf < uVar13) {
        iVar11 = uVar10 - 1;
        goto LAB_0023ea32;
      }
      pbVar14 = pbVar14 + 1;
      uVar10 = uVar10 - 1;
      in_EAX = uVar4;
    } while (1 < uVar10);
    iVar11 = 0;
    pbVar14 = (byte *)(glyph_name + 7);
LAB_0023ea32:
    if (iVar11 == 0) {
      if (*pbVar14 != 0) {
        if (*pbVar14 != 0x2e) goto LAB_0023ea36;
        in_EAX = in_EAX | 0x80000000;
      }
      bVar3 = false;
    }
    else {
LAB_0023ea36:
      bVar3 = true;
    }
    if (!bVar3) {
      return in_EAX;
    }
  }
  if (bVar16 != 0x75) goto LAB_0023eae2;
  pbVar14 = (byte *)(glyph_name + 1);
  uVar13 = 7;
  uVar10 = 0;
  do {
    bVar1 = *pbVar14;
    uVar4 = bVar1 - 0x37;
    if (bVar1 - 0x47 < 0xfffffffa) {
      uVar4 = 0x10;
    }
    if (bVar1 - 0x30 < 10) {
      uVar4 = bVar1 - 0x30;
    }
    uVar6 = uVar10 * 0x10 + uVar4;
    if (0xf < uVar4) {
      iVar11 = uVar13 - 1;
      goto LAB_0023eab8;
    }
    pbVar14 = pbVar14 + 1;
    uVar13 = uVar13 - 1;
    uVar10 = uVar6;
  } while (1 < uVar13);
  iVar11 = 0;
  pbVar14 = (byte *)(glyph_name + 7);
LAB_0023eab8:
  if (iVar11 < 3) {
    if (*pbVar14 != 0) {
      if (*pbVar14 != 0x2e) goto LAB_0023ead6;
      uVar10 = uVar10 | 0x80000000;
    }
    in_EAX = uVar10;
    bVar3 = false;
  }
  else {
LAB_0023ead6:
    bVar3 = true;
  }
  if (!bVar3) {
    return in_EAX;
  }
LAB_0023eae2:
  for (lVar17 = 0; (cVar2 = glyph_name[lVar17], cVar2 != '\0' && (cVar2 != '.'));
      lVar17 = lVar17 + 1) {
  }
  if (lVar17 == 0) {
    FVar5 = 0;
  }
  else {
    pbVar14 = (byte *)(glyph_name + 1);
    puVar15 = "";
    iVar11 = 0x34;
    FVar5 = 0;
    iVar8 = 0;
    do {
      FVar12 = 0;
      if (iVar11 <= iVar8) goto LAB_0023eb92;
      uVar19 = *(ushort *)(puVar15 + ((long)(iVar11 + iVar8) & 0xfffffffffffffffe)) << 8 |
               *(ushort *)(puVar15 + ((long)(iVar11 + iVar8) & 0xfffffffffffffffe)) >> 8;
      if ((""[uVar19] & 0x7f) == bVar16) {
        puVar15 = "" + uVar19;
        iVar9 = 5;
      }
      else {
        iVar7 = iVar11 + iVar8 >> 1;
        if ((char)(""[uVar19] & 0x7f) < (char)bVar16) {
          iVar8 = iVar7 + 1;
          iVar7 = iVar11;
        }
        iVar9 = 0;
        iVar11 = iVar7;
      }
    } while (iVar9 == 0);
    FVar12 = 0;
    if (iVar9 == 5) {
      FVar12 = FVar5;
      if (lVar17 != 1) {
        do {
          uVar10 = puVar15[1] & 0x7f;
          bVar16 = (byte)uVar10;
          if ((char)*puVar15 < '\0') {
            if (*pbVar14 != bVar16) goto LAB_0023eb92;
            puVar15 = puVar15 + 1;
          }
          else {
            if (bVar16 == 0) goto LAB_0023eb92;
            puVar18 = (ushort *)(puVar15 + (ulong)(puVar15[1] >> 7) * 2);
            iVar11 = uVar10 + 1;
            while( true ) {
              puVar18 = puVar18 + 1;
              uVar19 = *puVar18 << 8 | *puVar18 >> 8;
              puVar15 = "" + uVar19;
              if (*pbVar14 == (""[uVar19] & 0x7f)) break;
              iVar11 = iVar11 + -1;
              if (iVar11 < 2) goto LAB_0023eb92;
            }
          }
          pbVar14 = pbVar14 + 1;
        } while ((byte *)(glyph_name + lVar17) != pbVar14);
      }
      if ((-1 < (char)*puVar15) && ((char)puVar15[1] < '\0')) {
        FVar12 = (uint)(ushort)(*(ushort *)(puVar15 + 2) << 8 | *(ushort *)(puVar15 + 2) >> 8);
      }
    }
LAB_0023eb92:
    FVar5 = FVar12 + 0x80000000;
    if (cVar2 != '.') {
      FVar5 = FVar12;
    }
  }
  return FVar5;
}

Assistant:

static FT_UInt32
  ps_unicode_value( const char*  glyph_name )
  {
    /* If the name begins with `uni', then the glyph name may be a */
    /* hard-coded unicode character code.                          */
    if ( glyph_name[0] == 'u' &&
         glyph_name[1] == 'n' &&
         glyph_name[2] == 'i' )
    {
      /* determine whether the next four characters following are */
      /* hexadecimal.                                             */

      /* XXX: Add code to deal with ligatures, i.e. glyph names like */
      /*      `uniXXXXYYYYZZZZ'...                                   */

      FT_Int       count;
      FT_UInt32    value = 0;
      const char*  p     = glyph_name + 3;


      for ( count = 4; count > 0; count--, p++ )
      {
        char          c = *p;
        unsigned int  d;


        d = (unsigned char)c - '0';
        if ( d >= 10 )
        {
          d = (unsigned char)c - 'A';
          if ( d >= 6 )
            d = 16;
          else
            d += 10;
        }

        /* Exit if a non-uppercase hexadecimal character was found   */
        /* -- this also catches character codes below `0' since such */
        /* negative numbers cast to `unsigned int' are far too big.  */
        if ( d >= 16 )
          break;

        value = ( value << 4 ) + d;
      }

      /* there must be exactly four hex digits */
      if ( count == 0 )
      {
        if ( *p == '\0' )
          return value;
        if ( *p == '.' )
          return (FT_UInt32)( value | VARIANT_BIT );
      }
    }

    /* If the name begins with `u', followed by four to six uppercase */
    /* hexadecimal digits, it is a hard-coded unicode character code. */
    if ( glyph_name[0] == 'u' )
    {
      FT_Int       count;
      FT_UInt32    value = 0;
      const char*  p     = glyph_name + 1;


      for ( count = 6; count > 0; count--, p++ )
      {
        char          c = *p;
        unsigned int  d;


        d = (unsigned char)c - '0';
        if ( d >= 10 )
        {
          d = (unsigned char)c - 'A';
          if ( d >= 6 )
            d = 16;
          else
            d += 10;
        }

        if ( d >= 16 )
          break;

        value = ( value << 4 ) + d;
      }

      if ( count <= 2 )
      {
        if ( *p == '\0' )
          return value;
        if ( *p == '.' )
          return (FT_UInt32)( value | VARIANT_BIT );
      }
    }

    /* Look for a non-initial dot in the glyph name in order to */
    /* find variants like `A.swash', `e.final', etc.            */
    {
      FT_UInt32    value = 0;
      const char*  p     = glyph_name;


      for ( ; *p && *p != '.'; p++ )
        ;

      /* now look up the glyph in the Adobe Glyph List;      */
      /* `.notdef', `.null' and the empty name are short cut */
      if ( p > glyph_name )
      {
        value = (FT_UInt32)ft_get_adobe_glyph_index( glyph_name, p );

        if ( *p == '.' )
          value |= (FT_UInt32)VARIANT_BIT;
      }

      return value;
    }
  }